

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_11uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  int needed;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  
  if ((length & 0xfffffffffffffff8) == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    do {
      bVar1 = pSrc[1];
      bVar11 = pSrc[2];
      bVar2 = pSrc[3];
      bVar3 = pSrc[4];
      bVar4 = pSrc[5];
      bVar5 = pSrc[6];
      bVar6 = pSrc[7];
      bVar7 = pSrc[8];
      bVar8 = pSrc[9];
      bVar9 = pSrc[10];
      pDst[uVar16] = (uint)(bVar1 >> 5) + (uint)*pSrc * 8;
      pDst[uVar16 + 1] = (uint)(bVar11 >> 2) | (bVar1 & 0x1f) << 6;
      pDst[uVar16 + 2] = (uint)(bVar3 >> 7) | (bVar11 & 3) * 0x200 + (uint)bVar2 * 2;
      pDst[uVar16 + 3] = (uint)(bVar4 >> 4) | (bVar3 & 0x7f) << 4;
      pDst[uVar16 + 4] = (uint)(bVar5 >> 1) | (bVar4 & 0xf) << 7;
      pDst[uVar16 + 5] = (uint)(bVar7 >> 6) | (bVar5 & 1) * 0x400 + (uint)bVar6 * 4;
      pDst[uVar16 + 6] = (uint)(bVar8 >> 3) | (bVar7 & 0x3f) << 5;
      pDst[uVar16 + 7] = (bVar8 & 7) << 8 | (uint)bVar9;
      pSrc = pSrc + 0xb;
      uVar16 = uVar16 + 8;
    } while (uVar16 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar16] = (uint)(bVar1 >> 5) + (uint)*pSrc * 8;
    uVar12 = (uint)(length & 7);
    if (uVar12 != 1) {
      uVar17 = (uint)pSrc[2];
      pDst[uVar16 + 1] = (uint)(pSrc[2] >> 2) | (bVar1 & 0x1f) << 6;
      if (2 < uVar12) {
        iVar10 = 2;
        uVar15 = 0xb;
        uVar18 = 0;
        pbVar13 = pSrc + 3;
        do {
          pbVar14 = pbVar13;
          uVar15 = uVar15 - iVar10;
          bVar1 = (byte)uVar15 & 0x1f;
          uVar18 = (uVar18 | ~(-1 << (sbyte)iVar10) & uVar17) << bVar1;
          uVar17 = (uint)*pbVar14;
          pbVar13 = pbVar14 + 1;
          iVar10 = 8;
        } while (8 < uVar15);
        iVar10 = 8 - uVar15;
        pDst[uVar16 + 2] =
             ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar14 >> ((byte)iVar10 & 0x1f)) | uVar18;
        if (uVar12 != 3) {
          if (uVar15 == 8) {
            uVar17 = (uint)*pbVar13;
            pbVar13 = pbVar14 + 2;
            iVar10 = 8;
          }
          uVar15 = 0xb;
          uVar18 = 0 << bVar1;
          do {
            pbVar14 = pbVar13;
            uVar15 = uVar15 - iVar10;
            bVar1 = (byte)uVar15 & 0x1f;
            uVar18 = (uVar18 | ~(-1 << ((byte)iVar10 & 0x1f)) & uVar17) << bVar1;
            uVar17 = (uint)*pbVar14;
            pbVar13 = pbVar14 + 1;
            iVar10 = 8;
          } while (8 < uVar15);
          iVar10 = 8 - uVar15;
          pDst[uVar16 + 3] =
               ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar14 >> ((byte)iVar10 & 0x1f)) | uVar18;
          if (4 < uVar12) {
            if (uVar15 == 8) {
              uVar17 = (uint)*pbVar13;
              pbVar13 = pbVar14 + 2;
              iVar10 = 8;
            }
            uVar15 = 0xb;
            uVar18 = 0 << bVar1;
            do {
              pbVar14 = pbVar13;
              uVar15 = uVar15 - iVar10;
              bVar1 = (byte)uVar15 & 0x1f;
              uVar18 = (uVar18 | ~(-1 << ((byte)iVar10 & 0x1f)) & uVar17) << bVar1;
              uVar17 = (uint)*pbVar14;
              pbVar13 = pbVar14 + 1;
              iVar10 = 8;
            } while (8 < uVar15);
            iVar10 = 8 - uVar15;
            pDst[uVar16 + 4] =
                 ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar14 >> ((byte)iVar10 & 0x1f)) | uVar18
            ;
            if (uVar12 != 5) {
              if (uVar15 == 8) {
                uVar17 = (uint)*pbVar13;
                pbVar13 = pbVar14 + 2;
                iVar10 = 8;
              }
              uVar15 = 0xb;
              uVar18 = 0 << bVar1;
              do {
                pbVar14 = pbVar13;
                uVar15 = uVar15 - iVar10;
                uVar18 = (uVar18 | ~(-1 << ((byte)iVar10 & 0x1f)) & uVar17) << ((byte)uVar15 & 0x1f)
                ;
                uVar17 = (uint)*pbVar14;
                pbVar13 = pbVar14 + 1;
                iVar10 = 8;
              } while (8 < uVar15);
              iVar10 = 8 - uVar15;
              pDst[uVar16 + 5] =
                   ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar14 >> ((byte)iVar10 & 0x1f)) |
                   uVar18;
              if (uVar12 == 7) {
                if (uVar15 == 8) {
                  uVar17 = (uint)*pbVar13;
                  pbVar13 = pbVar14 + 2;
                  iVar10 = 8;
                }
                uVar12 = 0xb;
                uVar15 = 0;
                do {
                  uVar12 = uVar12 - iVar10;
                  bVar11 = (byte)uVar12;
                  uVar15 = (uVar15 | ~(-1 << ((byte)iVar10 & 0x1f)) & uVar17) << (bVar11 & 0x1f);
                  bVar1 = *pbVar13;
                  uVar17 = (uint)bVar1;
                  pbVar13 = pbVar13 + 1;
                  iVar10 = 8;
                } while (8 < uVar12);
                pDst[uVar16 + 6] =
                     ~(-1 << (bVar11 & 0x1f)) & (uint)(bVar1 >> (8 - bVar11 & 0x1f)) | uVar15;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_11uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		OPJ_UINT32 val7 = *pSrc++;
		OPJ_UINT32 val8 = *pSrc++;
		OPJ_UINT32 val9 = *pSrc++;
		OPJ_UINT32 val10 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 << 3) | (val1 >> 5));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0x1FU) << 6) | (val2 >> 2));
		pDst[i+2] = (OPJ_INT32)(((val2 & 0x3U) << 9) | (val3 << 1) | (val4 >> 7));
		pDst[i+3] = (OPJ_INT32)(((val4 & 0x7FU) << 4) | (val5 >> 4));
		pDst[i+4] = (OPJ_INT32)(((val5 & 0xFU) << 7) | (val6 >> 1));
		pDst[i+5] = (OPJ_INT32)(((val6 & 0x1U) << 10) | (val7 << 2) | (val8 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val8 & 0x3FU) << 5) | (val9 >> 3));
		pDst[i+7] = (OPJ_INT32)(((val9 & 0x7U) << 8) | (val10));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 11)
		
		if (length > 1U) {
			GETBITS(pDst[i+1], 11)
			if (length > 2U) {
				GETBITS(pDst[i+2], 11)
				if (length > 3U) {
					GETBITS(pDst[i+3], 11)
					if (length > 4U) {
						GETBITS(pDst[i+4], 11)
						if (length > 5U) {
							GETBITS(pDst[i+5], 11)
							if (length > 6U) {
								GETBITS(pDst[i+6], 11)
							}
						}
					}
				}
			}
		}
	}
}